

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlToSmf.h
# Opt level: O0

Smf * rlib::sequencer::mmlToSmf(string *mml)

{
  initializer_list<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>
  __l;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  pointer ppVar4;
  element_type *peVar5;
  Smf *in_RDI;
  const_iterator i;
  Event *ev;
  shared_ptr<const_rlib::sequencer::MmlCompiler::Event> *event;
  iterator __end3;
  iterator __begin3;
  multiset<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>,_rlib::sequencer::MmlCompiler::LessEvent,_std::allocator<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>_>_>
  *__range3;
  Track track;
  Port *port;
  const_iterator __end2;
  const_iterator __begin2;
  Result *__range2;
  Result result;
  Smf *smf;
  reference in_stack_fffffffffffffd58;
  EventMeta *in_stack_fffffffffffffd60;
  type_info *in_stack_fffffffffffffd68;
  const_iterator in_stack_fffffffffffffd70;
  EventMeta *in_stack_fffffffffffffd88;
  allocator_type *__a;
  less<std::type_index> *__comp;
  Smf *pSVar6;
  const_iterator in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  Type in_stack_fffffffffffffdcc;
  _Self local_230;
  element_type *local_228;
  undefined1 local_210 [128];
  undefined1 *local_190;
  undefined8 local_188;
  reference local_180;
  _Self local_178;
  _Self local_170;
  multiset<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>,_rlib::sequencer::MmlCompiler::LessEvent,_std::allocator<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>_>_>
  *local_168;
  _Base_ptr local_160;
  EventMeta local_120;
  _Base_ptr local_f8;
  allocator_type local_b8 [40];
  less<std::type_index> local_90 [48];
  reference local_60;
  Port *local_58;
  __normal_iterator<const_rlib::sequencer::MmlCompiler::Port_*,_std::vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>_>
  local_50;
  undefined1 *local_48;
  undefined1 local_29;
  undefined1 local_28 [40];
  
  pSVar6 = in_RDI;
  MmlCompiler::compile((string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  local_29 = 0;
  midi::Smf::Smf((Smf *)0x111bab);
  local_48 = local_28;
  local_50._M_current =
       (Port *)std::
               vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>
               ::begin((vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>
                        *)in_stack_fffffffffffffd58);
  local_58 = (Port *)std::
                     vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>
                     ::end((vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>
                            *)in_stack_fffffffffffffd58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_rlib::sequencer::MmlCompiler::Port_*,_std::vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>_>
                             *)in_stack_fffffffffffffd60,
                            (__normal_iterator<const_rlib::sequencer::MmlCompiler::Port_*,_std::vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>_>
                             *)in_stack_fffffffffffffd58), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_rlib::sequencer::MmlCompiler::Port_*,_std::vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>_>
               ::operator*(&local_50);
    __comp = local_90;
    midi::Smf::Track::Track((Track *)0x111c2c);
    midi::EventMeta::createText
              (in_stack_fffffffffffffdcc,(string *)in_stack_fffffffffffffdc0._M_node);
    std::make_shared<rlib::midi::EventMeta,rlib::midi::EventMeta>(in_stack_fffffffffffffd88);
    __a = local_b8;
    std::shared_ptr<rlib::midi::Event_const>::shared_ptr<rlib::midi::EventMeta,void>
              ((shared_ptr<const_rlib::midi::Event> *)in_stack_fffffffffffffd60,
               (shared_ptr<rlib::midi::EventMeta> *)in_stack_fffffffffffffd58);
    midi::Smf::Event::Event
              ((Event *)in_stack_fffffffffffffd70._M_node,(uint64_t)in_stack_fffffffffffffd68,
               (shared_ptr<const_rlib::midi::Event> *)in_stack_fffffffffffffd60);
    local_f8 = (_Base_ptr)
               std::
               multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
               ::emplace<rlib::midi::Smf::Event>
                         ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                           *)in_stack_fffffffffffffd68,(Event *)in_stack_fffffffffffffd60);
    midi::Smf::Event::~Event((Event *)0x111cc4);
    std::shared_ptr<const_rlib::midi::Event>::~shared_ptr
              ((shared_ptr<const_rlib::midi::Event> *)0x111cd1);
    std::shared_ptr<rlib::midi::EventMeta>::~shared_ptr
              ((shared_ptr<rlib::midi::EventMeta> *)0x111cde);
    midi::EventMeta::~EventMeta(in_stack_fffffffffffffd60);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      midi::EventMeta::createText
                (in_stack_fffffffffffffdcc,(string *)in_stack_fffffffffffffdc0._M_node);
      std::make_shared<rlib::midi::EventMeta,rlib::midi::EventMeta>(in_stack_fffffffffffffd88);
      in_stack_fffffffffffffd88 = &local_120;
      std::shared_ptr<rlib::midi::Event_const>::shared_ptr<rlib::midi::EventMeta,void>
                ((shared_ptr<const_rlib::midi::Event> *)in_stack_fffffffffffffd60,
                 (shared_ptr<rlib::midi::EventMeta> *)in_stack_fffffffffffffd58);
      midi::Smf::Event::Event
                ((Event *)in_stack_fffffffffffffd70._M_node,(uint64_t)in_stack_fffffffffffffd68,
                 (shared_ptr<const_rlib::midi::Event> *)in_stack_fffffffffffffd60);
      local_160 = (_Base_ptr)
                  std::
                  multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                  ::emplace<rlib::midi::Smf::Event>
                            ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                              *)in_stack_fffffffffffffd68,(Event *)in_stack_fffffffffffffd60);
      midi::Smf::Event::~Event((Event *)0x111dad);
      std::shared_ptr<const_rlib::midi::Event>::~shared_ptr
                ((shared_ptr<const_rlib::midi::Event> *)0x111dba);
      std::shared_ptr<rlib::midi::EventMeta>::~shared_ptr
                ((shared_ptr<rlib::midi::EventMeta> *)0x111dc7);
      midi::EventMeta::~EventMeta(in_stack_fffffffffffffd60);
    }
    local_168 = &local_60->eventList;
    local_170._M_node =
         (_Base_ptr)
         std::
         multiset<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>,_rlib::sequencer::MmlCompiler::LessEvent,_std::allocator<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>_>_>
         ::begin((multiset<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>,_rlib::sequencer::MmlCompiler::LessEvent,_std::allocator<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>_>_>
                  *)in_stack_fffffffffffffd58);
    local_178._M_node =
         (_Base_ptr)
         std::
         multiset<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>,_rlib::sequencer::MmlCompiler::LessEvent,_std::allocator<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>_>_>
         ::end((multiset<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>,_rlib::sequencer::MmlCompiler::LessEvent,_std::allocator<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>_>_>
                *)in_stack_fffffffffffffd58);
    while (bVar1 = std::operator!=(&local_170,&local_178), bVar1) {
      local_180 = std::
                  _Rb_tree_const_iterator<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>_>
                  ::operator*((_Rb_tree_const_iterator<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>_>
                               *)in_stack_fffffffffffffd60);
      if ((mmlToSmf(std::__cxx11::string_const&)::map == '\0') &&
         (iVar2 = __cxa_guard_acquire(&mmlToSmf(std::__cxx11::string_const&)::map), iVar2 != 0)) {
        std::
        pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
        ::
        pair<const_std::type_info_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tr_takatsuka[P]rlib_MML___sequencer_MmlToSmf_h:25:39),_true>
                  ((pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
                    *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68,
                   (anon_class_1_0_00000001 *)in_stack_fffffffffffffd60);
        std::
        pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
        ::
        pair<const_std::type_info_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tr_takatsuka[P]rlib_MML___sequencer_MmlToSmf_h:30:48),_true>
                  ((pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
                    *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68,
                   (anon_class_1_0_00000001 *)in_stack_fffffffffffffd60);
        std::
        pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
        ::
        pair<const_std::type_info_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tr_takatsuka[P]rlib_MML___sequencer_MmlToSmf_h:34:41),_true>
                  ((pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
                    *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68,
                   (anon_class_1_0_00000001 *)in_stack_fffffffffffffd60);
        std::
        pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
        ::
        pair<const_std::type_info_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tr_takatsuka[P]rlib_MML___sequencer_MmlToSmf_h:38:38),_true>
                  ((pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
                    *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68,
                   (anon_class_1_0_00000001 *)in_stack_fffffffffffffd60);
        std::
        pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
        ::
        pair<const_std::type_info_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tr_takatsuka[P]rlib_MML___sequencer_MmlToSmf_h:42:44),_true>
                  ((pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
                    *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68,
                   (anon_class_1_0_00000001 *)in_stack_fffffffffffffd60);
        std::
        pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
        ::
        pair<const_std::type_info_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tr_takatsuka[P]rlib_MML___sequencer_MmlToSmf_h:46:48),_true>
                  ((pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
                    *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68,
                   (anon_class_1_0_00000001 *)in_stack_fffffffffffffd60);
        std::
        pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
        ::
        pair<const_std::type_info_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tr_takatsuka[P]rlib_MML___sequencer_MmlToSmf_h:50:40),_true>
                  ((pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
                    *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68,
                   (anon_class_1_0_00000001 *)in_stack_fffffffffffffd60);
        std::
        pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
        ::
        pair<const_std::type_info_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tr_takatsuka[P]rlib_MML___sequencer_MmlToSmf_h:54:39),_true>
                  ((pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>
                    *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68,
                   (anon_class_1_0_00000001 *)in_stack_fffffffffffffd60);
        local_190 = local_210;
        local_188 = 8;
        std::
        allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>
        ::allocator((allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>
                     *)0x1120ae);
        __l._M_len = (size_type)in_stack_fffffffffffffdc0._M_node;
        __l._M_array = (iterator)pSVar6;
        std::
        map<std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&),_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>_>
        ::map((map<std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&),_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>_>
               *)in_RDI,__l,__comp,__a);
        std::
        allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>
        ::~allocator((allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>
                      *)0x1120e6);
        __cxa_atexit(std::
                     map<std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&),_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>_>
                     ::~map,&mmlToSmf::map,&__dso_handle);
        __cxa_guard_release(&mmlToSmf(std::__cxx11::string_const&)::map);
      }
      local_228 = std::
                  __shared_ptr_access<const_rlib::sequencer::MmlCompiler::Event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<const_rlib::sequencer::MmlCompiler::Event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)in_stack_fffffffffffffd60);
      in_stack_fffffffffffffd68 = (type_info *)&stack0xfffffffffffffdc8;
      std::type_index::type_index
                ((type_index *)in_stack_fffffffffffffd68,(type_info *)local_228->_vptr_Event[-1]);
      in_stack_fffffffffffffd70 =
           std::
           map<std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&),_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>_>
           ::find((map<std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&),_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>_>
                   *)in_stack_fffffffffffffd58,(key_type *)0x112150);
      local_230._M_node = in_stack_fffffffffffffd70._M_node;
      in_stack_fffffffffffffdc0 =
           std::
           map<std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&),_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>_>
           ::end((map<std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&),_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>_>
                  *)in_stack_fffffffffffffd58);
      bVar1 = std::operator!=(&local_230,(_Self *)&stack0xfffffffffffffdc0);
      if (bVar1) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>
                               *)0x112194);
        in_stack_fffffffffffffd60 = (EventMeta *)ppVar4->second;
        in_stack_fffffffffffffd58 = local_60;
        peVar5 = std::
                 __shared_ptr_access<const_rlib::sequencer::MmlCompiler::Event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<const_rlib::sequencer::MmlCompiler::Event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)in_stack_fffffffffffffd60);
        (*(code *)in_stack_fffffffffffffd60)(local_90,in_stack_fffffffffffffd58,peVar5);
      }
      std::_Rb_tree_const_iterator<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>_>::
      operator++((_Rb_tree_const_iterator<std::shared_ptr<const_rlib::sequencer::MmlCompiler::Event>_>
                  *)in_stack_fffffffffffffd60);
    }
    std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::
    emplace_back<rlib::midi::Smf::Track>
              ((list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *)
               in_stack_fffffffffffffd70._M_node,(Track *)in_stack_fffffffffffffd68);
    midi::Smf::Track::~Track((Track *)0x112250);
    __gnu_cxx::
    __normal_iterator<const_rlib::sequencer::MmlCompiler::Port_*,_std::vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>_>
    ::operator++(&local_50);
  }
  local_29 = 1;
  std::
  vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>::
  ~vector((vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>
           *)in_stack_fffffffffffffd70._M_node);
  return in_RDI;
}

Assistant:

inline midi::Smf mmlToSmf(const std::string& mml) {
		using Smf = midi::Smf;
		const auto result = MmlCompiler::compile(mml);
		Smf smf;
		for (const auto& port : result) {
			Smf::Track track;

			track.events.emplace(Smf::Event(0, std::make_shared<midi::EventMeta>(midi::EventMeta::createText(midi::EventMeta::Type::sequenceName, port.name))));
			if (!port.instrument.empty()) {
				track.events.emplace(Smf::Event(0, std::make_shared<midi::EventMeta>(midi::EventMeta::createText(midi::EventMeta::Type::instrumentName, port.instrument))));
			}

			for (const auto& event : port.eventList) {
				static const std::map<std::type_index, void (*)(Smf::Track&, const MmlCompiler::Port&, const MmlCompiler::Event&)> map = {
					{typeid(MmlCompiler::EventNote), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventNote&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventNoteOn>(port.channel, e.note, e.velocity)));
						track.events.insert(Smf::Event(e.position + e.length, std::make_shared<midi::EventNoteOff>(port.channel, e.note, 0)));
					}},
					{typeid(MmlCompiler::EventProgramChange), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventProgramChange&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventProgramChange>(port.channel, e.programNo)));
					}},
					{typeid(MmlCompiler::EventVolume), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventVolume&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventControlChange>(port.channel, midi::EventControlChange::Type::volume, e.volume)));
					}},
					{typeid(MmlCompiler::EventPan), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventPan&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventControlChange>(port.channel, midi::EventControlChange::Type::pan, e.pan)));
					}},
					{typeid(MmlCompiler::EventPitchBend), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventPitchBend&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventPitchBend>(port.channel, e.pitchBend)));
					}},
					{typeid(MmlCompiler::EventControlChange), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventControlChange&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventControlChange>(port.channel, e.no, e.value)));
					}},
					{typeid(MmlCompiler::EventTempo), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventTempo&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventMeta>(midi::EventMeta::createTempo(e.tempo))));
					}},
					{typeid(MmlCompiler::EventMeta), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventMeta&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventMeta>(midi::EventMeta::createText(static_cast<midi::EventMeta::Type>(e.type), e.data))));
					}},
				};
				const auto &ev = *event;
				if (auto i = map.find(typeid(ev)); i != map.end()) {
					(i->second)(track, port, *event);
				} else assert(false);
			}
			smf.tracks.emplace_back(std::move(track));
		}

		return smf;
	}